

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgesturerecognizer.cpp
# Opt level: O0

void __thiscall QGestureRecognizer::reset(QGestureRecognizer *this,QGesture *gesture)

{
  QGesturePrivate *pQVar1;
  long in_RSI;
  long in_FS_OFFSET;
  QGesturePrivate *d;
  QPointF local_28;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != 0) {
    pQVar1 = QGesture::d_func((QGesture *)0x330d86);
    pQVar1->state = NoGesture;
    QPointF::QPointF(&local_18);
    (pQVar1->hotSpot).xp = local_18.xp;
    (pQVar1->hotSpot).yp = local_18.yp;
    QPointF::QPointF(&local_28);
    (pQVar1->sceneHotSpot).xp = local_28.xp;
    (pQVar1->sceneHotSpot).yp = local_28.yp;
    pQVar1->field_0xa0 = pQVar1->field_0xa0 & 0xfe;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGestureRecognizer::reset(QGesture *gesture)
{
    if (gesture) {
        QGesturePrivate *d = gesture->d_func();
        d->state = Qt::NoGesture;
        d->hotSpot = QPointF();
        d->sceneHotSpot = QPointF();
        d->isHotSpotSet = false;
    }
}